

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O3

void Gia_IsoTest(Gia_Man_t *p,Abc_Cex_t *pCex,int fVerbose)

{
  void *pvVar1;
  int iVar2;
  Vec_Int_t *vPiPerm;
  Gia_Man_t *pGVar3;
  Abc_Cex_t *p_00;
  char *pcVar4;
  long lVar5;
  Vec_Ptr_t *vPisPerm;
  Vec_Ptr_t *vPosEquivs;
  Vec_Ptr_t *local_58;
  Gia_Man_t *local_50;
  Gia_Man_t *local_48;
  Gia_Man_t *local_40;
  Vec_Ptr_t *local_38;
  
  iVar2 = p->nRegs;
  if (p->vCos->nSize - iVar2 != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                  ,0x507,"void Gia_IsoTest(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  if (0 < iVar2) {
    vPiPerm = Gia_IsoTestGenPerm(p->vCis->nSize - iVar2);
    puts("Considering random permutation of the primary inputs of the AIG:");
    printf("Vector has %d entries: {",(ulong)(uint)vPiPerm->nSize);
    if (0 < vPiPerm->nSize) {
      lVar5 = 0;
      do {
        printf(" %d",(ulong)(uint)vPiPerm->pArray[lVar5]);
        lVar5 = lVar5 + 1;
      } while (lVar5 < vPiPerm->nSize);
    }
    puts(" }");
    pGVar3 = Gia_ManDupPerm(p,vPiPerm);
    local_40 = Gia_ManDupAppendNew(p,pGVar3);
    local_48 = Gia_ManIsoReduce(local_40,&local_38,&local_58,0,0,0,0);
    iVar2 = local_38->nSize;
    if (0 < iVar2) {
      lVar5 = 0;
      do {
        pvVar1 = local_38->pArray[lVar5];
        if (pvVar1 != (void *)0x0) {
          if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar1 + 8));
          }
          free(pvVar1);
          iVar2 = local_38->nSize;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar2);
    }
    if (local_38->pArray != (void **)0x0) {
      free(local_38->pArray);
    }
    free(local_38);
    if ((0 < local_58->nSize) && (local_50 = pGVar3, local_58->nSize != 1)) {
      p_00 = Abc_CexPermuteTwo(pCex,(Vec_Int_t *)*local_58->pArray,(Vec_Int_t *)local_58->pArray[1])
      ;
      iVar2 = local_58->nSize;
      if (0 < iVar2) {
        lVar5 = 0;
        do {
          pvVar1 = local_58->pArray[lVar5];
          if (pvVar1 != (void *)0x0) {
            if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar1 + 8));
            }
            free(pvVar1);
            iVar2 = local_58->nSize;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar2);
      }
      if (local_58->pArray != (void **)0x0) {
        free(local_58->pArray);
      }
      free(local_58);
      iVar2 = Gia_ManVerifyCex(p,pCex,0);
      pcVar4 = "CEX for the init AIG is valid.";
      if (iVar2 == 0) {
        pcVar4 = "CEX for the init AIG is not valid.";
      }
      puts(pcVar4);
      pGVar3 = local_50;
      iVar2 = Gia_ManVerifyCex(local_50,p_00,0);
      pcVar4 = "CEX for the perm AIG is valid.";
      if (iVar2 == 0) {
        pcVar4 = "CEX for the perm AIG is not valid.";
      }
      puts(pcVar4);
      Gia_ManStop(local_48);
      Gia_ManStop(local_40);
      Gia_ManStop(pGVar3);
      if (vPiPerm->pArray != (int *)0x0) {
        free(vPiPerm->pArray);
      }
      free(vPiPerm);
      Abc_CexFree(p_00);
      return;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  __assert_fail("Gia_ManRegNum(p) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                ,0x508,"void Gia_IsoTest(Gia_Man_t *, Abc_Cex_t *, int)");
}

Assistant:

void Gia_IsoTest( Gia_Man_t * p, Abc_Cex_t * pCex, int fVerbose )
{
    Abc_Cex_t * pCexNew;
    Vec_Int_t * vPiPerm;
    Vec_Ptr_t * vPosEquivs, * vPisPerm;
    Vec_Int_t * vPerm0, * vPerm1;
    Gia_Man_t * pPerm, * pDouble, * pAig;
    assert( Gia_ManPoNum(p) == 1 );
    assert( Gia_ManRegNum(p) > 0 );
    // generate random permutation of PIs
    vPiPerm = Gia_IsoTestGenPerm( Gia_ManPiNum(p) );
    printf( "Considering random permutation of the primary inputs of the AIG:\n" );
    Vec_IntPrint( vPiPerm );
    // create AIG with two primary outputs (original and permuted)
    pPerm = Gia_ManDupPerm( p, vPiPerm );
    pDouble = Gia_ManDupAppendNew( p, pPerm );
//Gia_AigerWrite( pDouble, "test.aig", 0, 0, 0 );

    // analyze the two-output miter
    pAig = Gia_ManIsoReduce( pDouble, &vPosEquivs, &vPisPerm, 0, 0, 0, 0 );
    Vec_VecFree( (Vec_Vec_t *)vPosEquivs );

    // given CEX for output 0, derive CEX for output 1
    vPerm0 = (Vec_Int_t *)Vec_PtrEntry( vPisPerm, 0 );
    vPerm1 = (Vec_Int_t *)Vec_PtrEntry( vPisPerm, 1 );
    pCexNew = Abc_CexPermuteTwo( pCex, vPerm0, vPerm1 );
    Vec_VecFree( (Vec_Vec_t *)vPisPerm );

    // check that original CEX and the resulting CEX is valid
    if ( Gia_ManVerifyCex(p, pCex, 0) )
        printf( "CEX for the init AIG is valid.\n" );
    else
        printf( "CEX for the init AIG is not valid.\n" );
    if ( Gia_ManVerifyCex(pPerm, pCexNew, 0) )
        printf( "CEX for the perm AIG is valid.\n" );
    else
        printf( "CEX for the perm AIG is not valid.\n" );
    // delete
    Gia_ManStop( pAig );
    Gia_ManStop( pDouble );
    Gia_ManStop( pPerm );
    Vec_IntFree( vPiPerm );
    Abc_CexFree( pCexNew );
}